

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

int Abc_SclObjCheckMarkedFanFans(Abc_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 1;
  if ((pObj->field_0x14 & 0x20) == 0) {
    lVar2 = (long)(pObj->vFanins).nSize;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        if ((*(byte *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]] + 0x14) & 0x20
            ) != 0) {
          return 1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    lVar2 = (long)(pObj->vFanouts).nSize;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        if ((*(byte *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]] + 0x14) &
            0x20) != 0) {
          return 1;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Abc_SclObjCheckMarkedFanFans( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pNext;
    int i;
    if ( pObj->fMarkB )
        return 1;
    Abc_ObjForEachFanin( pObj, pNext, i )
        if ( pNext->fMarkB )
            return 1;
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext->fMarkB )
            return 1;
    return 0;
}